

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btok_bauth.c
# Opt level: O2

err_t btokBAuthTStart(void *state,bign_params *params,bake_settings *settings,octet *privkey,
                     bake_cert *cert)

{
  long lVar1;
  ulong count;
  long *plVar2;
  long lVar3;
  bool_t bVar4;
  err_t eVar5;
  int iVar6;
  u64 *dest;
  word *a;
  word *stack;
  
  bVar4 = memIsValid(params,0x150);
  eVar5 = 0x6d;
  if ((((bVar4 != 0) && (bVar4 = memIsValid(settings,0x38), bVar4 != 0)) && (settings->kca == 1)) &&
     (((settings->helloa == (void *)0x0 ||
       (bVar4 = memIsValid(settings->helloa,settings->helloa_len), bVar4 != 0)) &&
      ((settings->hellob == (void *)0x0 ||
       (bVar4 = memIsValid(settings->hellob,settings->hellob_len), bVar4 != 0)))))) {
    bVar4 = bignIsOperable(params);
    if (bVar4 == 0) {
      eVar5 = 0x1f6;
    }
    else if (settings->rng == (gen_i)0x0) {
      eVar5 = 0x130;
    }
    else {
      bVar4 = memIsValid(privkey,params->l >> 2);
      if (((bVar4 != 0) && (bVar4 = memIsValid(cert,0x18), bVar4 != 0)) &&
         ((bVar4 = memIsValid(cert->data,cert->len), bVar4 != 0 &&
          (cert->val != (bake_certval_i)0x0)))) {
        eVar5 = bignStart((void *)((long)state + 0x238),params);
        if (eVar5 == 0) {
          *(void **)((long)state + 0x18) = (void *)((long)state + 0x238);
          lVar1 = *(long *)(*(long *)((long)state + 0x250) + 0x30);
          count = *(ulong *)(*(long *)((long)state + 0x250) + 0x38);
          memCopy((void *)((long)state + 0x38),params,0x150);
          memCopy((void *)((long)state + 0x188),settings,0x38);
          plVar2 = *(long **)((long)state + 0x18);
          dest = (u64 *)(*plVar2 + (long)plVar2);
          *(u64 **)((long)state + 0x20) = dest;
          *(u64 **)((long)state + 0x28) = dest + lVar1;
          *(u64 **)((long)state + 0x30) = dest + lVar1 + lVar1 * 2;
          *(ulong *)state = *plVar2 + (count >> 1) + lVar1 * 0x18 + 0x238;
          *(undefined8 *)((long)state + 8) = 3;
          *(undefined8 *)((long)state + 0x10) = 1;
          u64From(dest,privkey,count);
          a = (word *)(*state + (long)state);
          eVar5 = (*cert->val)((octet *)a,params,cert->data,cert->len);
          if (eVar5 == 0) {
            stack = a + lVar1 * 2;
            lVar3 = *(long *)(*(long *)((long)state + 0x18) + 0x18);
            iVar6 = (**(code **)(lVar3 + 0x40))(a,a,lVar3,stack);
            eVar5 = 0x202;
            if (((iVar6 != 0) &&
                (lVar3 = *(long *)(*(long *)((long)state + 0x18) + 0x18),
                iVar6 = (**(code **)(lVar3 + 0x40))(a + lVar1,count + (long)a,lVar3,stack),
                iVar6 != 0)) &&
               (bVar4 = ecpIsOnA(a,*(ec_o **)((long)state + 0x18),stack), bVar4 != 0)) {
              memCopy((void *)((long)state + 0x1c0),cert,0x18);
              eVar5 = 0;
            }
          }
        }
      }
    }
  }
  return eVar5;
}

Assistant:

err_t btokBAuthTStart(void* state, const bign_params* params,
	const bake_settings* settings, const octet privkey[],
	const bake_cert* cert)
{
	err_t code;
	bake_bauth_t_o* s = (bake_bauth_t_o*)state;
	size_t n, no;
	// стек
	word* Q;
	void* stack;
	// проверить входные данные
	if (!memIsValid(params, sizeof(bign_params)) ||
		!memIsValid(settings, sizeof(bake_settings)) ||
		settings->kca != TRUE ||
		!memIsNullOrValid(settings->helloa, settings->helloa_len) ||
		!memIsNullOrValid(settings->hellob, settings->hellob_len))
		return ERR_BAD_INPUT;
	if (!bignIsOperable(params))
		return ERR_BAD_PARAMS;
	if (settings->rng == 0)
		return ERR_BAD_RNG;
	if (!memIsValid(privkey, params->l / 4) ||
		!memIsValid(cert, sizeof(bake_cert)) ||
		!memIsValid(cert->data, cert->len) ||
		cert->val == 0)
		return ERR_BAD_INPUT;
	// загрузить параметры
	code = bignStart(s->data, params);
	ERR_CALL_CHECK(code);
	s->ec = (ec_o*)s->data;
	n = s->ec->f->n, no = s->ec->f->no;
	// сохранить параметры
	memCopy(s->params, params, sizeof(bign_params));
	// сохранить настройки
	memCopy(s->settings, settings, sizeof(bake_settings));
	// настроить указатели
	s->d = objEnd(s->ec, word);
	s->Vct = s->d + n;
	s->R = (octet*)(s->Vct + 2 * n);
	// настроить заголовок
	s->hdr.keep = sizeof(bake_bauth_t_o) + objKeep(s->ec) +
		3 * O_OF_W(n) + no / 2;
	s->hdr.p_count = 3;
	s->hdr.o_count = 1;
	// загрузить личный ключ
	wwFrom(s->d, privkey, no);
	// раскладка стека
	Q = objEnd(s, word);
	stack = Q + 2 * n;
	// проверить сертификат и его открытый ключ
	code = cert->val((octet*)Q, params, cert->data, cert->len);
	ERR_CALL_CHECK(code);
	if (!qrFrom(ecX(Q), (octet*)Q, s->ec->f, stack) ||
		!qrFrom(ecY(Q, n), (octet*)Q + no, s->ec->f, stack) ||
		!ecpIsOnA(Q, s->ec, stack))
		return ERR_BAD_CERT;
	// сохранить сертификат
	memCopy(s->cert, cert, sizeof(bake_cert));
	// все нормально
	return code;
}